

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure745.c
# Opt level: O1

void test_write_disk_secure745(void)

{
  int iVar1;
  archive *_a;
  archive_entry *paVar2;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                  ,L',',L'\x12');
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                   ,L'/',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ā');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                     ,L'3',"target",L'ǀ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                     ,L'6',"sandbox",L'ǀ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                  ,L'7',"sandbox");
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                   ,L':',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"sym");
  archive_entry_set_mode(paVar2,0xa1ff);
  archive_entry_copy_symlink(paVar2,"../target");
  iVar1 = archive_write_header(_a,paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                   ,L'B',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"sym");
  archive_entry_set_mode(paVar2,0x41ff);
  iVar1 = archive_write_header(_a,paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                   ,L'E',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar2);
  assertion_file_mode("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                      ,L'I',"../target",L'ǀ');
  iVar1 = archive_write_close(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure745.c"
                   ,L'K',(uint)(iVar1 == 0),"0 == archive_write_close(a)",(void *)0x0);
  archive_write_free(_a);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure745)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);

	/* The target dir:  The one we're going to try to change permission on */
	assertMakeDir("target", 0700);

	/* The sandbox dir we're going to run inside of. */
	assertMakeDir("sandbox", 0700);
	assertChdir("sandbox");

	/* Create a symlink pointing to the target directory */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "sym");
	archive_entry_set_mode(ae, AE_IFLNK | 0777);
	archive_entry_copy_symlink(ae, "../target");
	assert(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Try to alter the target dir through the symlink; this should fail. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "sym");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assert(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Permission of target dir should not have changed. */
	assertFileMode("../target", 0700);

	assert(0 == archive_write_close(a));
	archive_write_free(a);
#endif
}